

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_simd_qshl(DisasContext_conflict1 *s,_Bool scalar,_Bool is_q,_Bool src_unsigned,
                     _Bool dst_unsigned,int immh,int immb,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  NeonGenTwo64OpEnvFn *pNVar1;
  NeonGenTwoOpEnvFn *pNVar2;
  _Bool _Var3;
  TCGv_i64 pTVar4;
  TCGv_i64 tcg_dest;
  TCGv_i32 pTVar5;
  TCGv_i32 tcg_dest_00;
  MemOp memop;
  uint uVar6;
  uint val;
  int iVar7;
  int element;
  uintptr_t o;
  
  if (immh == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (immh != 0) {
      for (; (uint)immh >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  memop = (MO_ALIGN_2|MO_BESL|MO_16) - uVar6;
  if (scalar && is_q) {
    __assert_fail("!(scalar && is_q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x2142,
                  "void handle_simd_qshl(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int)"
                 );
  }
  val = (-8 << ((byte)memop & 0x1f)) + (immh * 8 | immb);
  tcg_ctx = s->uc->tcg_ctx;
  if (!scalar) {
    if ((immh & 8U) != 0 && !is_q) {
      unallocated_encoding_aarch64(s);
      return;
    }
    if (1 < uVar6 - 0x1c) {
      if (uVar6 != 0x1e) {
        if (uVar6 != 0x1f) {
          iVar7 = 0x2159;
LAB_0064169f:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,iVar7,(char *)0x0);
        }
        val = val | val * 0x100;
      }
      val = val | val << 0x10;
    }
  }
  _Var3 = fp_access_check(s);
  if (!_Var3) {
    return;
  }
  if (uVar6 == 0x1c) {
    pTVar4 = tcg_const_i64_aarch64(tcg_ctx,(long)(int)val);
    pNVar1 = handle_simd_qshl::fns[src_unsigned][dst_unsigned];
    for (iVar7 = 0; is_q + 1 != iVar7; iVar7 = iVar7 + 1) {
      tcg_dest = tcg_temp_new_i64(tcg_ctx);
      read_vec_element(s,tcg_dest,rn,iVar7,MO_64);
      (*pNVar1)(tcg_ctx,tcg_dest,tcg_ctx->cpu_env,tcg_dest,pTVar4);
      write_vec_element(s,tcg_dest,rd,iVar7,MO_64);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  }
  else {
    pTVar5 = tcg_const_i32_aarch64(tcg_ctx,val);
    pNVar2 = handle_simd_qshl::fns_1[src_unsigned][dst_unsigned][(int)memop];
    if (!scalar) {
      memop = MO_32;
    }
    iVar7 = 1;
    if (!scalar) {
      iVar7 = is_q + 2 + (uint)is_q;
    }
    for (element = 0; iVar7 != element; element = element + 1) {
      tcg_dest_00 = tcg_temp_new_i32(tcg_ctx);
      read_vec_element_i32(s,tcg_dest_00,rn,element,memop);
      (*pNVar2)(tcg_ctx,tcg_dest_00,tcg_ctx->cpu_env,tcg_dest_00,pTVar5);
      if (scalar) {
        if (uVar6 != 0x1d) {
          if (uVar6 == 0x1e) {
            tcg_gen_ext16u_i32_aarch64(tcg_ctx,tcg_dest_00,tcg_dest_00);
          }
          else {
            if (uVar6 != 0x1f) {
              iVar7 = 0x219a;
              goto LAB_0064169f;
            }
            tcg_gen_ext8u_i32_aarch64(tcg_ctx,tcg_dest_00,tcg_dest_00);
          }
        }
        write_fp_sreg(s,rd,tcg_dest_00);
      }
      else {
        write_vec_element_i32(s,tcg_dest_00,rd,element,MO_32);
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_00 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    if (scalar) {
      return;
    }
  }
  clear_vec_high(s,is_q,rd);
  return;
}

Assistant:

static void handle_simd_qshl(DisasContext *s, bool scalar, bool is_q,
                             bool src_unsigned, bool dst_unsigned,
                             int immh, int immb, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int immhb = immh << 3 | immb;
    int size = 32 - clz32(immh) - 1;
    int shift = immhb - (8 << size);
    int pass;

    assert(immh != 0);
    assert(!(scalar && is_q));

    if (!scalar) {
        if (!is_q && extract32(immh, 3, 1)) {
            unallocated_encoding(s);
            return;
        }

        /* Since we use the variable-shift helpers we must
         * replicate the shift count into each element of
         * the tcg_shift value.
         */
        switch (size) {
        case 0:
            shift |= shift << 8;
            /* fall through */
        case 1:
            shift |= shift << 16;
            break;
        case 2:
        case 3:
            break;
        default:
            g_assert_not_reached();
        }
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_shift = tcg_const_i64(tcg_ctx, shift);
        static NeonGenTwo64OpEnvFn * const fns[2][2] = {
            { gen_helper_neon_qshl_s64, gen_helper_neon_qshlu_s64 },
            { NULL, gen_helper_neon_qshl_u64 },
        };
        NeonGenTwo64OpEnvFn *genfn = fns[src_unsigned][dst_unsigned];
        int maxpass = is_q ? 2 : 1;

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);
            genfn(tcg_ctx, tcg_op, tcg_ctx->cpu_env, tcg_op, tcg_shift);
            write_vec_element(s, tcg_op, rd, pass, MO_64);

            tcg_temp_free_i64(tcg_ctx, tcg_op);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_shift);
        clear_vec_high(s, is_q, rd);
    } else {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, shift);
        static NeonGenTwoOpEnvFn * const fns[2][2][3] = {
            {
                { gen_helper_neon_qshl_s8,
                  gen_helper_neon_qshl_s16,
                  gen_helper_neon_qshl_s32 },
                { gen_helper_neon_qshlu_s8,
                  gen_helper_neon_qshlu_s16,
                  gen_helper_neon_qshlu_s32 }
            }, {
                { NULL, NULL, NULL },
                { gen_helper_neon_qshl_u8,
                  gen_helper_neon_qshl_u16,
                  gen_helper_neon_qshl_u32 }
            }
        };
        NeonGenTwoOpEnvFn *genfn = fns[src_unsigned][dst_unsigned][size];
        MemOp memop = scalar ? size : MO_32;
        int maxpass = scalar ? 1 : is_q ? 4 : 2;

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, memop);
            genfn(tcg_ctx, tcg_op, tcg_ctx->cpu_env, tcg_op, tcg_shift);
            if (scalar) {
                switch (size) {
                case 0:
                    tcg_gen_ext8u_i32(tcg_ctx, tcg_op, tcg_op);
                    break;
                case 1:
                    tcg_gen_ext16u_i32(tcg_ctx, tcg_op, tcg_op);
                    break;
                case 2:
                    break;
                default:
                    g_assert_not_reached();
                }
                write_fp_sreg(s, rd, tcg_op);
            } else {
                write_vec_element_i32(s, tcg_op, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_shift);

        if (!scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
}